

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O0

matrix<unsigned_int,_521UL> *
trng::power<unsigned_int,521ul>(matrix<unsigned_int,_521UL> *a,unsigned_long_long m)

{
  ulong in_RDX;
  matrix<unsigned_int,_521UL> *in_RDI;
  matrix_type powers;
  anon_class_1_0_00000001 unit;
  matrix_type *res;
  matrix<unsigned_int,_521UL> *this;
  ulong local_18;
  
  this = in_RDI;
  matrix<unsigned_int,521ul>::
  matrix<trng::power<unsigned_int,521ul>(trng::matrix<unsigned_int,521ul>const&,unsigned_long_long)::_lambda(unsigned_long,unsigned_long)_1_>
            ();
  matrix<unsigned_int,_521UL>::matrix(this,in_RDI);
  local_18 = in_RDX;
  while (local_18 != 0) {
    if ((local_18 & 1) == 1) {
      operator*((matrix<unsigned_int,_521UL> *)
                powers.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish,
                (matrix<unsigned_int,_521UL> *)
                powers.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start);
      matrix<unsigned_int,_521UL>::operator=(this,in_RDI);
      matrix<unsigned_int,_521UL>::~matrix((matrix<unsigned_int,_521UL> *)0x2db2ea);
    }
    local_18 = local_18 >> 1;
    if (local_18 == 0) break;
    operator*((matrix<unsigned_int,_521UL> *)
              powers.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish,
              (matrix<unsigned_int,_521UL> *)
              powers.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start);
    matrix<unsigned_int,_521UL>::operator=(this,in_RDI);
    matrix<unsigned_int,_521UL>::~matrix((matrix<unsigned_int,_521UL> *)0x2db35d);
  }
  matrix<unsigned_int,_521UL>::~matrix((matrix<unsigned_int,_521UL> *)0x2db371);
  return this;
}

Assistant:

matrix<T, n> power(const matrix<T, n> &a, unsigned long long m) {
    using matrix_type = matrix<T, n>;
    using size_type = typename matrix_type::size_type;

    auto unit = [&](size_type i, size_type j) -> T { return i == j ? T{1} : T{0}; };
    matrix_type res(unit);
    matrix_type powers(a);
    while (m > 0) {
      if ((m & 1ull) == 1ull)
        res = res * powers;
      m >>= 1u;
      if (m == 0)
        break;
      powers = powers * powers;
    }
    return res;
  }